

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O3

Array<kj::_::HashBucket> * __thiscall
kj::_::rehash(Array<kj::_::HashBucket> *__return_storage_ptr__,_ *this,
             ArrayPtr<const_kj::_::HashBucket> oldBuckets,size_t targetSize)

{
  uint uVar1;
  HashBucket *__s;
  HashBucket *pHVar2;
  ulong uVar3;
  ulong uVar4;
  HashBucket *elementCount;
  HashBucket *__begin2;
  Fault f;
  Fault local_28;
  
  pHVar2 = oldBuckets.ptr;
  if (0x3fffffff < oldBuckets.size_) {
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[36]>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
               ,0x99,FAILED,"targetSize < (1 << 30)","\"hash table has reached maximum size\"",
               (char (*) [36])"hash table has reached maximum size");
    Debug::Fault::fatal(&local_28);
  }
  if (oldBuckets.size_ == 0) {
    elementCount = (HashBucket *)0x0;
  }
  else {
    uVar1 = 0x1f;
    if ((uint)oldBuckets.size_ != 0) {
      for (; (uint)oldBuckets.size_ >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    elementCount = *(HashBucket **)(PRIMES + ((uVar1 ^ 0x1fffffe0) * 8 + 0x108));
  }
  if (elementCount <= pHVar2) {
    elementCount = pHVar2;
  }
  __s = (HashBucket *)
        HeapArrayDisposer::allocateImpl
                  (8,(size_t)elementCount,(size_t)elementCount,(_func_void_void_ptr *)0x0,
                   (_func_void_void_ptr *)0x0);
  __return_storage_ptr__->ptr = __s;
  __return_storage_ptr__->size_ = (size_t)elementCount;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
  memset(__s,0,(long)elementCount << 3);
  if (pHVar2 != (HashBucket *)0x0) {
    pHVar2 = (HashBucket *)(this + (long)pHVar2 * 8);
    do {
      if (1 < ((HashBucket *)this)->value) {
        uVar3 = (ulong)((HashBucket *)this)->hash % __return_storage_ptr__->size_;
        while (__return_storage_ptr__->ptr[uVar3].value != 0) {
          uVar4 = uVar3 + 1;
          uVar3 = 0;
          if (uVar4 != __return_storage_ptr__->size_) {
            uVar3 = uVar4 & 0xffffffff;
          }
        }
        __return_storage_ptr__->ptr[uVar3] = *(HashBucket *)this;
      }
      this = (_ *)((long)this + 8);
    } while ((HashBucket *)this != pHVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Array<HashBucket> rehash(kj::ArrayPtr<const HashBucket> oldBuckets, size_t targetSize) {
  // Rehash the whole table.

  KJ_REQUIRE(targetSize < (1 << 30), "hash table has reached maximum size");

  size_t size = chooseHashTableSize(targetSize);

  if (size < oldBuckets.size()) {
    size = oldBuckets.size();
  }

  auto newBuckets = kj::heapArray<HashBucket>(size);
  memset(newBuckets.begin(), 0, sizeof(HashBucket) * size);

  for (auto& oldBucket: oldBuckets) {
    if (oldBucket.isOccupied()) {
      for (uint i = oldBucket.hash % newBuckets.size();; i = probeHash(newBuckets, i)) {
        auto& newBucket = newBuckets[i];
        if (newBucket.isEmpty()) {
          newBucket = oldBucket;
          break;
        }
      }
    }
  }

  return newBuckets;
}